

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
          (SmallVectorBase<slang::ConstantValue> *this,ConstantValue *args)

{
  SmallVectorBase<slang::ConstantValue> *in_RDI;
  ConstantValue *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ConstantValue> *in_stack_00000030;
  ConstantValue *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ConstantValue>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    end(in_RDI);
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }